

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

Sampler * vkt::texture::util::createSampler
                    (Sampler *__return_storage_ptr__,WrapMode wrapU,WrapMode wrapV,
                    FilterMode minFilterMode,FilterMode magFilterMode)

{
  FilterMode magFilterMode_local;
  FilterMode minFilterMode_local;
  WrapMode wrapV_local;
  WrapMode wrapU_local;
  
  createSampler(__return_storage_ptr__,wrapU,wrapV,wrapU,minFilterMode,magFilterMode);
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler createSampler (tcu::Sampler::WrapMode wrapU, tcu::Sampler::WrapMode wrapV, tcu::Sampler::FilterMode minFilterMode, tcu::Sampler::FilterMode magFilterMode)
{
	return createSampler(wrapU, wrapV, wrapU, minFilterMode, magFilterMode);
}